

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O0

void __thiscall L10_2::Stock::buy(Stock *this,long num,double price)

{
  double price_local;
  long num_local;
  Stock *this_local;
  
  if (num < 0) {
    std::operator<<((ostream *)&std::cout,
                    "Number of shares purchased can\'t be negative. Transaction is aborted.\n");
  }
  else {
    this->shares = num + this->shares;
    this->share_val = price;
    set_tot(this);
  }
  return;
}

Assistant:

void L10_2::Stock::buy(long num, double price) {
    if (num < 0) {
        std::cout << "Number of shares purchased can't be negative. Transaction is aborted.\n";
    } else {
        shares += num;
        share_val = price;
        set_tot();
    }
}